

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_search_tree_kernel_2.h
# Opt level: O1

void __thiscall
dlib::
binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::memory_manager_kernel_2<char,_10UL>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::binary_search_tree_kernel_2
          (binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::memory_manager_kernel_2<char,_10UL>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *this)

{
  node *pnVar1;
  
  (this->
  super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._vptr_enumerable = (_func_int **)&PTR__binary_search_tree_kernel_2_00319f60;
  (this->
  super_asc_pair_remover<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ).
  super_pair_remover<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._vptr_pair_remover = (_func_int **)&PTR__binary_search_tree_kernel_2_00319fc0;
  (this->pool)._vptr_memory_manager_kernel_2 = (_func_int **)&PTR__memory_manager_kernel_2_0031a028;
  (this->pool).allocations = 0;
  (this->pool).next = (node *)0x0;
  (this->pool).first_chunk = (chunk_node *)0x0;
  pnVar1 = memory_manager_kernel_2<dlib::binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::memory_manager_kernel_2<char,_10UL>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::node,_10UL>
           ::allocate(&this->pool);
  this->NIL = pnVar1;
  this->tree_size = 0;
  this->tree_root = pnVar1;
  this->current_element = (node *)0x0;
  this->at_start_ = true;
  (this->p).
  super_map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._vptr_map_pair = (_func_int **)&PTR__map_pair_0031a058;
  pnVar1->color = '\x01';
  pnVar1->left = (node *)0x0;
  pnVar1->right = (node *)0x0;
  pnVar1->parent = (node *)0x0;
  return;
}

Assistant:

binary_search_tree_kernel_2(
            ) :
                NIL(pool.allocate()),
                tree_size(0),
                tree_root(NIL),
                current_element(0),
                at_start_(true)
            {
                NIL->color = black;
                NIL->left = 0;
                NIL->right = 0;
                NIL->parent = 0;
            }